

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O0

void tabwrite_float(t_tabwrite *x,t_float f)

{
  int iVar1;
  int local_2c;
  t_word *ptStack_28;
  int n;
  t_word *vec;
  _garray *a;
  int vecsize;
  t_float f_local;
  t_tabwrite *x_local;
  
  a._4_4_ = f;
  _vecsize = x;
  vec = (t_word *)pd_findbyclass(x->x_arrayname,garray_class);
  if (vec == (t_word *)0x0) {
    pd_error(_vecsize,"%s: no such array",_vecsize->x_arrayname->s_name);
  }
  else {
    iVar1 = garray_getfloatwords((_garray *)vec,(int *)&a,&stack0xffffffffffffffd8);
    if (iVar1 == 0) {
      pd_error(_vecsize,"%s: bad template for tabwrite",_vecsize->x_arrayname->s_name);
    }
    else {
      local_2c = (int)_vecsize->x_ft1;
      if (local_2c < 0) {
        local_2c = 0;
      }
      else if ((int)a <= local_2c) {
        local_2c = (int)a + -1;
      }
      ptStack_28[local_2c].w_float = a._4_4_;
      garray_redraw((_garray *)vec);
    }
  }
  return;
}

Assistant:

static void tabwrite_float(t_tabwrite *x, t_float f)
{
    int vecsize;
    t_garray *a;
    t_word *vec;

    if (!(a = (t_garray *)pd_findbyclass(x->x_arrayname, garray_class)))
        pd_error(x, "%s: no such array", x->x_arrayname->s_name);
    else if (!garray_getfloatwords(a, &vecsize, &vec))
        pd_error(x, "%s: bad template for tabwrite", x->x_arrayname->s_name);
    else
    {
        int n = x->x_ft1;
        if (n < 0)
            n = 0;
        else if (n >= vecsize)
            n = vecsize-1;
        vec[n].w_float = f;
        garray_redraw(a);
    }
}